

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetPluginTest.cpp
# Opt level: O1

void __thiscall
TEST_SetPointerPluginTest_doublePointer_Test::testBody
          (TEST_SetPointerPluginTest_doublePointer_Test *this)

{
  TestRegistry *pTVar1;
  size_t sVar2;
  UtestShell *this_00;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  bool bVar5;
  
  this_00 = (UtestShell *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
                         ,0xa4);
  this_00->_vptr_UtestShell = (_func_int **)0x0;
  this_00->group_ = (char *)0x0;
  this_00->name_ = (char *)0x0;
  this_00->file_ = (char *)0x0;
  this_00->lineNumber_ = 0;
  this_00->next_ = (UtestShell *)0x0;
  this_00->isRunAsSeperateProcess_ = false;
  this_00->hasFailed_ = false;
  *(undefined6 *)&this_00->field_0x32 = 0;
  UtestShell::UtestShell(this_00);
  this_00->_vptr_UtestShell = (_func_int **)&PTR__ExecFunctionTestShell_00352700;
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).myRegistry_;
  (*pTVar1->_vptr_TestRegistry[2])(pTVar1,this_00);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).myRegistry_;
  (*pTVar1->_vptr_TestRegistry[5])
            (pTVar1,(this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).result_);
  pUVar3 = UtestShell::getCurrent();
  bVar5 = orig_double_ptr == &orig_double;
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)bVar5,"CHECK","orig_double_ptr == &orig_double",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
             ,0xa8,pTVar4);
  pUVar3 = UtestShell::getCurrent();
  sVar2 = ((this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).result_)->checkCount_;
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,1,sVar2,"LONGS_EQUAL(1, result_->getCheckCount()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
             ,0xa9,pTVar4);
  (*this_00->_vptr_UtestShell[1])(this_00);
  return;
}

Assistant:

TEST(SetPointerPluginTest, doublePointer)
{
    SetDoublePointerUtestShell *doubletst = new SetDoublePointerUtestShell();
    myRegistry_->addTest(doubletst);
    myRegistry_->runAllTests(*result_);

    CHECK(orig_double_ptr == &orig_double);
    LONGS_EQUAL(1, result_->getCheckCount());
    delete doubletst;
}